

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.c
# Opt level: O0

apx_error_t
state_create_child_value_from_child_state(apx_vm_readState_t *self,apx_vm_readState_t *child_state)

{
  dtl_hv_t *pdVar1;
  _Bool _Var2;
  char *pcVar3;
  apx_vm_readState_t *child_state_local;
  apx_vm_readState_t *self_local;
  
  if ((self != (apx_vm_readState_t *)0x0) && (child_state != (apx_vm_readState_t *)0x0)) {
    if (self->value_type == DTL_DV_HASH) {
      _Var2 = adt_str_is_empty(&self->field_name);
      if (_Var2) {
        self_local._4_4_ = 0x1b;
      }
      else {
        switch(child_state->value_type) {
        case DTL_DV_INVALID:
        case DTL_DV_NULL:
          return 0x43;
        case DTL_DV_SCALAR:
          pdVar1 = (self->value).hv;
          pcVar3 = adt_str_cstr(&self->field_name);
          dtl_hv_set_cstr(pdVar1,pcVar3,(child_state->value).dv,true);
          break;
        case DTL_DV_ARRAY:
          pdVar1 = (self->value).hv;
          pcVar3 = adt_str_cstr(&self->field_name);
          dtl_hv_set_cstr(pdVar1,pcVar3,(child_state->value).dv,true);
          break;
        case DTL_DV_HASH:
          pdVar1 = (self->value).hv;
          pcVar3 = adt_str_cstr(&self->field_name);
          dtl_hv_set_cstr(pdVar1,pcVar3,(child_state->value).dv,true);
        }
        self_local._4_4_ = 0;
      }
      return self_local._4_4_;
    }
    __assert_fail("self->value_type == DTL_DV_HASH",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/deserializer.c"
                  ,0x4bd,
                  "apx_error_t state_create_child_value_from_child_state(apx_vm_readState_t *, apx_vm_readState_t *)"
                 );
  }
  __assert_fail("(self != NULL) && (child_state != NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/deserializer.c"
                ,0x4bc,
                "apx_error_t state_create_child_value_from_child_state(apx_vm_readState_t *, apx_vm_readState_t *)"
               );
}

Assistant:

static apx_error_t state_create_child_value_from_child_state(apx_vm_readState_t* self, apx_vm_readState_t* child_state)
{
   assert( (self != NULL) && (child_state != NULL) );
   assert(self->value_type == DTL_DV_HASH);
   if (adt_str_is_empty(&self->field_name))
   {
      return APX_NAME_MISSING_ERROR;
   }
   switch (child_state->value_type)
   {
   case DTL_DV_INVALID:
   case DTL_DV_NULL:
      return APX_VALUE_TYPE_ERROR;
   case DTL_DV_SCALAR:
      dtl_hv_set_cstr(self->value.hv, adt_str_cstr(&self->field_name), (dtl_dv_t*)child_state->value.sv, true);
      break;
   case DTL_DV_ARRAY:
      dtl_hv_set_cstr(self->value.hv, adt_str_cstr(&self->field_name), (dtl_dv_t*)child_state->value.av, true);
      break;
   case DTL_DV_HASH:
      dtl_hv_set_cstr(self->value.hv, adt_str_cstr(&self->field_name), (dtl_dv_t*)child_state->value.hv, true);
      break;
   }
   return APX_NO_ERROR;
}